

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::import_physical_entity
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number,geo_argument *physical_type)

{
  iterator __position;
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  int *piVar7;
  long lVar8;
  ostream *poVar9;
  undefined8 uVar10;
  char *pcVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  string *n;
  vector<int,_std::allocator<int>_> elements;
  string group_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_c0;
  vector<int,_std::allocator<int>_> local_88;
  int local_6c;
  string *local_68;
  int *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  geo_argument *local_38;
  
  __position._M_current =
       (split_string_vector->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_68 = import_path;
  local_60 = line_number;
  local_38 = physical_type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,__position);
  local_c0.first._M_dataplus._M_p = "\"";
  local_c0.first._M_string_length = 0x176454;
  pcVar13 = ((__position._M_current)->_M_dataplus)._M_p;
  sVar6 = (__position._M_current)->_M_string_length;
  pcVar11 = pcVar13 + sVar6;
  for (; pcVar14 = pcVar11, sVar6 != 0; sVar6 = sVar6 - 1) {
    if (*pcVar13 == '\"') {
      pcVar11 = pcVar13 + 1;
      pcVar14 = pcVar13;
      break;
    }
    pcVar13 = pcVar13 + 1;
  }
  if (pcVar14 != pcVar11) {
    boost::algorithm::detail::
    find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
              (__position._M_current);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,
             (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + pbVar1->_M_string_length);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pbVar3 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  n = pbVar1 + 1;
  if (n != pbVar3) {
    do {
      bVar4 = is_integer(n);
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_68->_M_dataplus)._M_p,local_68->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        goto LAB_0012d8ec;
      }
      pcVar11 = (n->_M_dataplus)._M_p;
      piVar7 = __errno_location();
      iVar12 = *piVar7;
      *piVar7 = 0;
      lVar8 = strtol(pcVar11,(char **)&local_c0,10);
      if (local_c0.first._M_dataplus._M_p == pcVar11) {
        std::__throw_invalid_argument("stoi");
LAB_0012d960:
        uVar10 = std::__throw_out_of_range("stoi");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::~pair(&local_c0);
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar10);
      }
      iVar5 = (int)lVar8;
      if ((iVar5 != lVar8) || (*piVar7 == 0x22)) goto LAB_0012d960;
      if (*piVar7 == 0) {
        *piVar7 = iVar12;
      }
      local_6c = iVar5;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar5;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      n = n + 1;
    } while (n != pbVar3);
  }
  switch(*local_38) {
  case ePhysical_Curve:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_c0,&local_58,&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_curves_map,&local_c0);
    break;
  case ePhysical_Point:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_c0,&local_58,&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_points_map,&local_c0);
    break;
  case ePhysical_Surface:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_c0,&local_58,&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_surfaces_map,&local_c0);
    break;
  case ePhysical_Volume:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_c0,&local_58,&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_volumes_map,&local_c0);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Unrecognized Physical Element at line ",0x2d);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_68->_M_dataplus)._M_p,local_68->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_0012d8ec:
    std::ostream::put((char)poVar9);
    iVar12 = 1;
    std::ostream::flush();
    goto LAB_0012d904;
  }
  if (local_c0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  iVar12 = 0;
LAB_0012d904:
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar12;
}

Assistant:

int GEO::geofile::import_physical_entity(   std::vector<std::string> &split_string_vector,
                                            std::string &import_path,
                                            int &line_number,
                                            geo_argument &physical_type)
{
    auto it = split_string_vector.begin();
    split_string_vector.erase(it);
    boost::erase_all( *it, "\"" );
    it=std::prev(split_string_vector.end(),1);
    split_string_vector.erase(it);
    it = split_string_vector.begin();
    std::string group_name = *it++;
    std::vector<int> elements;
    auto ssv_end = split_string_vector.end();
    while (it != ssv_end)
    {
        if (is_integer(*it))
        {
            elements.push_back(std::stoi(*it++));
        }
        else
        {
            std::cout << "Error: Invalid value (line "
            << line_number << " of "
            << import_path << ")" << std::endl;
            return EXIT_FAILURE;
        }
    }
    switch (physical_type)
    {
    case ePhysical_Point:
        physical_points_map.insert({group_name, elements});
        break;
    case ePhysical_Curve:
        physical_curves_map.insert({group_name, elements});
        break;
    case ePhysical_Surface:
        physical_surfaces_map.insert({group_name, elements});
        break;
    case ePhysical_Volume:
        physical_volumes_map.insert({group_name, elements});
        break;
    default:
        std:: cout  << "Error: Unrecognized Physical Element at line "
                    << line_number << " of "
                    << import_path << "." << std::endl;
        return EXIT_FAILURE;
        break;
    }
    return EXIT_SUCCESS;
}